

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O0

Status __thiscall leveldb::anon_unknown_0::MergingIterator::status(MergingIterator *this)

{
  bool bVar1;
  long in_RSI;
  IteratorWrapper *in_RDI;
  int i;
  Status *status;
  IteratorWrapper *this_00;
  int local_18;
  
  this_00 = in_RDI;
  Status::Status((Status *)in_RDI);
  local_18 = 0;
  while( true ) {
    if (*(int *)(in_RSI + 0x38) <= local_18) {
      return (Status)(char *)this_00;
    }
    IteratorWrapper::status(in_RDI);
    Status::operator=((Status *)this_00,(Status *)in_RDI);
    Status::~Status((Status *)this_00);
    bVar1 = Status::ok((Status *)in_RDI);
    if (!bVar1) break;
    local_18 = local_18 + 1;
  }
  return (Status)(char *)this_00;
}

Assistant:

Status status() const override {
    Status status;
    for (int i = 0; i < n_; i++) {
      status = children_[i].status();
      if (!status.ok()) {
        break;
      }
    }
    return status;
  }